

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O2

void __thiscall
vkt::image::anon_unknown_2::BinaryAtomicIntermValuesInstance::commandsBeforeCompute
          (BinaryAtomicIntermValuesInstance *this,VkCommandBuffer cmdBuffer)

{
  VkImageSubresourceRange subresourceRange;
  deUint32 dVar1;
  DeviceInterface *pDVar2;
  VkImageMemoryBarrier imagePreDispatchBarrier;
  
  pDVar2 = Context::getDeviceInterface
                     ((this->super_BinaryAtomicInstanceBase).super_TestInstance.m_context);
  dVar1 = getNumLayers((this->super_BinaryAtomicInstanceBase).m_imageType,
                       &(this->super_BinaryAtomicInstanceBase).m_imageSize);
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = dVar1;
  makeImageMemoryBarrier
            (&imagePreDispatchBarrier,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_GENERAL,
             (VkImage)(((this->m_intermResultsImage).
                        super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.
                        m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                      object.m_internal,subresourceRange);
  (*pDVar2->_vptr_DeviceInterface[0x6d])
            (pDVar2,cmdBuffer,1,0x800,0,0,0,0,0,1,(int)&imagePreDispatchBarrier);
  return;
}

Assistant:

void BinaryAtomicIntermValuesInstance::commandsBeforeCompute (const VkCommandBuffer cmdBuffer) const
{
	const DeviceInterface&			deviceInterface		= m_context.getDeviceInterface();
	const VkImageSubresourceRange	subresourceRange	= makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, getNumLayers(m_imageType, m_imageSize));

	const VkImageMemoryBarrier	imagePreDispatchBarrier =
		makeImageMemoryBarrier(	0u,
								VK_ACCESS_SHADER_WRITE_BIT,
								VK_IMAGE_LAYOUT_UNDEFINED,
								VK_IMAGE_LAYOUT_GENERAL,
								m_intermResultsImage->get(),
								subresourceRange);

	deviceInterface.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, DE_FALSE, 0u, DE_NULL, 0u, DE_NULL, 1u, &imagePreDispatchBarrier);
}